

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

uint P_GetStackPortal(AActor *point,int plane)

{
  FSectorPortal *pFVar1;
  FSectorPortal *pFVar2;
  uint uVar3;
  ulong uVar4;
  
  TArray<FSectorPortal,_FSectorPortal>::Grow(&sectorPortals,1);
  uVar3 = sectorPortals.Count;
  pFVar2 = sectorPortals.Array;
  uVar4 = (ulong)sectorPortals.Count;
  sectorPortals.Count = sectorPortals.Count + 1;
  pFVar1 = sectorPortals.Array + uVar4;
  pFVar1->mType = 0;
  pFVar1->mFlags = 0;
  pFVar1->mPartner = 0;
  pFVar1->mPlane = 0;
  pFVar2[uVar4].mPlaneZ = 0.0;
  *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar2[uVar4].mPlaneZ + 1) =
       (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  pFVar2[uVar4].mDisplacement.X = 0.0;
  pFVar2[uVar4].mDisplacement.Y = 0.0;
  pFVar2[uVar4].mOrigin = (sector_t *)0x0;
  (&pFVar2[uVar4].mOrigin)[1] = (sector_t *)0x0;
  pFVar2[uVar4].mType = 1;
  pFVar2[uVar4].mPlane = plane;
  pFVar2[uVar4].mOrigin = ((point->target).field_0.p)->Sector;
  pFVar2[uVar4].mDestination = point->Sector;
  pFVar2[uVar4].mPlaneZ = 3.4028234663852886e+38;
  pFVar2[uVar4].mSkybox.field_0.p = point;
  return uVar3;
}

Assistant:

unsigned P_GetStackPortal(AActor *point, int plane)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_STACKEDSECTORTHING;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = point->target->Sector;
	sectorPortals[i].mDestination = point->Sector;
	sectorPortals[i].mPlaneZ = FLT_MAX;
	sectorPortals[i].mSkybox = point;
	return i;
}